

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr_test.cpp
# Opt level: O3

void __thiscall unique_ptr_compare_ptr_Test::TestBody(unique_ptr_compare_ptr_Test *this)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  bool bVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  ((AssertHelperData *)local_20.ptr_)->type = 0x7b;
  Struct2::_mNbInstances = Struct2::_mNbInstances + 1;
  local_38.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,unique_ptr<Struct2>>
            (local_30,"true","xPtr",(bool *)&local_38,(unique_ptr<Struct2> *)&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xcb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = (AssertHelperData *)local_20.ptr_;
  testing::internal::CmpHelperNE<void*,Struct2*>
            (local_30,"(void*)__null","xPtr.get()",&local_38.ptr_,(Struct2 **)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.ptr_._0_4_ = 0x7b;
  if ((AssertHelperData *)local_20.ptr_ != (AssertHelperData *)0x0) {
    testing::internal::CmpHelperEQ<int,int>
              (local_30,"123","xPtr->mVal",(int *)&local_38,(int *)local_20.ptr_);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xcd,pcVar4);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if ((AssertHelperData *)local_38.ptr_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((AssertHelperData *)local_38.ptr_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_38.ptr_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              (local_30,"1","Struct2::_mNbInstances",(int *)&local_38,&Struct2::_mNbInstances);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xce,pcVar4);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    sVar2.ptr_ = local_20.ptr_;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
    Struct2::_mNbInstances = Struct2::_mNbInstances + 1;
    ((AssertHelperData *)local_38.ptr_)->type = 0xea;
    local_40.data_._0_1_ = 1;
    testing::internal::CmpHelperEQ<bool,unique_ptr<Struct2>>
              (local_30,"true","xPtr",(bool *)&local_40,(unique_ptr<Struct2> *)&local_20);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xd4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_40.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40.data_ = (AssertHelperData *)0x0;
    local_48.data_ = (AssertHelperData *)local_20.ptr_;
    testing::internal::CmpHelperNE<void*,Struct2*>
              (local_30,"(void*)__null","xPtr.get()",&local_40.data_,(Struct2 **)&local_48);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xd5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_40.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40.data_._0_4_ = 0x7b;
    if ((AssertHelperData *)local_20.ptr_ != (AssertHelperData *)0x0) {
      testing::internal::CmpHelperEQ<int,int>
                (local_30,"123","xPtr->mVal",(int *)&local_40,(int *)local_20.ptr_);
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                   ,0xd6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_40.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_40.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                (local_30,"2","Struct2::_mNbInstances",(int *)&local_40,&Struct2::_mNbInstances);
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                   ,0xd7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_40.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_40.data_._0_1_ = 1;
      testing::internal::CmpHelperEQ<bool,unique_ptr<Struct2>>
                (local_30,"true","yPtr",(bool *)&local_40,(unique_ptr<Struct2> *)&local_38);
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                   ,0xd9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_40.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_40.data_ = (AssertHelperData *)0x0;
      local_48.data_ = (AssertHelperData *)local_38.ptr_;
      testing::internal::CmpHelperNE<void*,Struct2*>
                (local_30,"(void*)__null","yPtr.get()",&local_40.data_,(Struct2 **)&local_48);
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                   ,0xda,pcVar4);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_40.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_40.data_._0_4_ = 0xea;
      if ((AssertHelperData *)local_38.ptr_ != (AssertHelperData *)0x0) {
        testing::internal::CmpHelperEQ<int,int>
                  (local_30,"234","yPtr->mVal",(int *)&local_40,(int *)local_38.ptr_);
        if (local_30[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          if (local_28.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                     ,0xdb,pcVar4);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_40.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_40.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        sVar1.ptr_ = local_38.ptr_;
        testing::internal::CmpHelperNE<unique_ptr<Struct2>,unique_ptr<Struct2>>
                  (local_30,"xPtr","yPtr",(unique_ptr<Struct2> *)&local_20,
                   (unique_ptr<Struct2> *)&local_38);
        if (local_30[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          if (local_28.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                     ,0xde,pcVar4);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_40.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_40.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (sVar2.ptr_ < sVar1.ptr_) {
          testing::internal::CmpHelperLT<unique_ptr<Struct2>,unique_ptr<Struct2>>
                    (local_30,"xPtr","yPtr",(unique_ptr<Struct2> *)&local_20,
                     (unique_ptr<Struct2> *)&local_38);
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                       ,0xe1,pcVar4);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_40.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_40.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperLE<unique_ptr<Struct2>,unique_ptr<Struct2>>
                    (local_30,"xPtr","yPtr",(unique_ptr<Struct2> *)&local_20,
                     (unique_ptr<Struct2> *)&local_38);
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                       ,0xe2,pcVar4);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_40.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_40.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperGT<unique_ptr<Struct2>,unique_ptr<Struct2>>
                    (local_30,"yPtr","xPtr",(unique_ptr<Struct2> *)&local_38,
                     (unique_ptr<Struct2> *)&local_20);
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                       ,0xe3,pcVar4);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_40.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_40.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperGE<unique_ptr<Struct2>,unique_ptr<Struct2>>
                    (local_30,"yPtr","xPtr",(unique_ptr<Struct2> *)&local_38,
                     (unique_ptr<Struct2> *)&local_20);
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                       ,0xe4,pcVar4);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_40.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_40.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::CmpHelperGT<unique_ptr<Struct2>,unique_ptr<Struct2>>
                    (local_30,"xPtr","yPtr",(unique_ptr<Struct2> *)&local_20,
                     (unique_ptr<Struct2> *)&local_38);
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                       ,0xe8,pcVar4);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_40.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_40.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperGE<unique_ptr<Struct2>,unique_ptr<Struct2>>
                    (local_30,"xPtr","yPtr",(unique_ptr<Struct2> *)&local_20,
                     (unique_ptr<Struct2> *)&local_38);
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                       ,0xe9,pcVar4);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_40.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_40.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperLT<unique_ptr<Struct2>,unique_ptr<Struct2>>
                    (local_30,"yPtr","xPtr",(unique_ptr<Struct2> *)&local_38,
                     (unique_ptr<Struct2> *)&local_20);
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                       ,0xea,pcVar4);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_40.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_40.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperLE<unique_ptr<Struct2>,unique_ptr<Struct2>>
                    (local_30,"yPtr","xPtr",(unique_ptr<Struct2> *)&local_38,
                     (unique_ptr<Struct2> *)&local_20);
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                       ,0xeb,pcVar4);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_40.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_40.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_40.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        if ((AssertHelperData *)local_38.ptr_ != (AssertHelperData *)0x0) {
          Struct2::_mNbInstances = Struct2::_mNbInstances + -1;
        }
        operator_delete(local_38.ptr_,4);
        if ((AssertHelperData *)local_20.ptr_ != (AssertHelperData *)0x0) {
          Struct2::_mNbInstances = Struct2::_mNbInstances + -1;
        }
        operator_delete(local_20.ptr_,4);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          return;
        }
        __stack_chk_fail();
      }
    }
  }
  __assert_fail("__null != px",
                "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/include/unique_ptr.hpp"
                ,0x81,"T *unique_ptr<Struct2>::operator->() const [T = Struct2]");
}

Assistant:

TEST(unique_ptr, compare_ptr)
{
    // Create a unique_ptr
    unique_ptr<Struct2> xPtr(new Struct2(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(1, Struct2::_mNbInstances);
    Struct2* pX = xPtr.get();

    // Create another unique_ptr
    unique_ptr<Struct2> yPtr(new Struct2(234));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(2, Struct2::_mNbInstances);

    EXPECT_EQ(true, yPtr);
    EXPECT_NE((void*)NULL, yPtr.get());
    EXPECT_EQ(234, yPtr->mVal);
    Struct2* pY = yPtr.get();

    EXPECT_NE(xPtr, yPtr);
    if (pX < pY)
    {
        EXPECT_LT(xPtr, yPtr);
        EXPECT_LE(xPtr, yPtr);
        EXPECT_GT(yPtr, xPtr);
        EXPECT_GE(yPtr, xPtr);
    }
    else // (pX > pY)
    {
        EXPECT_GT(xPtr, yPtr);
        EXPECT_GE(xPtr, yPtr);
        EXPECT_LT(yPtr, xPtr);
        EXPECT_LE(yPtr, xPtr);
    }
}